

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

exr_result_t
exr_encoding_choose_default_routines
          (exr_const_context_t ctxt,int part_index,exr_encode_pipeline_t *encode)

{
  _internal_exr_part *p_Var1;
  internal_exr_pack_fn p_Var2;
  exr_encode_pipeline_t *in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  bool bVar3;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  int32_t isdeep;
  exr_result_t local_4;
  
  if (in_RDI == (_internal_exr_context *)0x0) {
    local_4 = 2;
  }
  else {
    if (in_RDI->mode == '\x01') {
      internal_exr_lock(in_RDI);
    }
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      local_4 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      p_Var1 = in_RDI->parts[(int)in_ESI];
      if (in_RDX == (exr_encode_pipeline_t *)0x0) {
        if (in_RDI->mode == '\x01') {
          internal_exr_unlock(in_RDI);
        }
        local_4 = (*in_RDI->standard_error)(in_RDI,3);
      }
      else if (((_internal_exr_context *)in_RDX->context == in_RDI) &&
              (in_RDX->part_index == in_ESI)) {
        bVar3 = true;
        if (p_Var1->storage_mode != EXR_STORAGE_DEEP_SCANLINE) {
          bVar3 = p_Var1->storage_mode == EXR_STORAGE_DEEP_TILED;
        }
        p_Var2 = internal_exr_match_encode(in_RDX,(uint)bVar3);
        in_RDX->convert_and_pack_fn = (_func_exr_result_t__exr_encode_pipeline_ptr *)p_Var2;
        if (p_Var1->comp_type != EXR_COMPRESSION_NONE) {
          in_RDX->compress_fn = default_compress_chunk;
        }
        in_RDX->yield_until_ready_fn = default_yield;
        in_RDX->write_fn = default_write_chunk;
        if (in_RDI->mode == '\x01') {
          internal_exr_unlock(in_RDI);
        }
        local_4 = 0;
      }
      else {
        if (in_RDI->mode == '\x01') {
          internal_exr_unlock(in_RDI);
        }
        local_4 = (*in_RDI->print_error)
                            (in_RDI,3,
                             "Cross-wired request for default routines from different context / part"
                            );
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_encoding_choose_default_routines (
    exr_const_context_t ctxt, int part_index, exr_encode_pipeline_t* encode)
{
    int32_t isdeep = 0;
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    if (!encode)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT));

    if (encode->context != ctxt || encode->part_index != part_index)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Cross-wired request for default routines from different context / part"));

    isdeep = (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
              part->storage_mode == EXR_STORAGE_DEEP_TILED)
                 ? 1
                 : 0;

    encode->convert_and_pack_fn = internal_exr_match_encode (encode, isdeep);
    if (part->comp_type != EXR_COMPRESSION_NONE)
        encode->compress_fn = &default_compress_chunk;
    encode->yield_until_ready_fn = &default_yield;
    encode->write_fn             = &default_write_chunk;

    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (EXR_ERR_SUCCESS);
}